

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

void __thiscall
ON_Annotation::SetTextMask(ON_Annotation *this,ON_DimStyle *parent_style,ON_TextMask *mask)

{
  double value;
  bool value_00;
  MaskType value_01;
  MaskFrame value_02;
  ON_Color value_03;
  ON_TextMask local_mask;
  ON_TextMask local_48;
  
  local_48.m_content_hash.m_digest._12_8_ = *(undefined8 *)((mask->m_content_hash).m_digest + 0xc);
  local_48.m_bDrawMask = mask->m_bDrawMask;
  local_48.m_mask_type = mask->m_mask_type;
  local_48.m_mask_frame = mask->m_mask_frame;
  local_48.m_reserved2 = mask->m_reserved2;
  local_48.m_mask_color.field_0 = (mask->m_mask_color).field_0;
  local_48.m_mask_border = mask->m_mask_border;
  local_48.m_reserved3 = mask->m_reserved3;
  local_48.m_content_hash.m_digest[0] = (mask->m_content_hash).m_digest[0];
  local_48.m_content_hash.m_digest[1] = (mask->m_content_hash).m_digest[1];
  local_48.m_content_hash.m_digest[2] = (mask->m_content_hash).m_digest[2];
  local_48.m_content_hash.m_digest[3] = (mask->m_content_hash).m_digest[3];
  local_48.m_content_hash.m_digest._4_8_ = *(undefined8 *)((mask->m_content_hash).m_digest + 4);
  value_00 = ON_TextMask::DrawTextMask(&local_48);
  SetDrawTextMask(this,parent_style,value_00);
  value_03 = ON_TextMask::MaskColor(&local_48);
  SetMaskColor(this,parent_style,value_03);
  value_01 = ON_TextMask::MaskFillType(&local_48);
  SetMaskFillType(this,parent_style,value_01);
  value = ON_TextMask::MaskBorder(&local_48);
  SetMaskBorder(this,parent_style,value);
  value_02 = ON_TextMask::MaskFrameType(&local_48);
  SetMaskFrameType(this,parent_style,value_02);
  return;
}

Assistant:

void ON_Annotation::SetTextMask(const ON_DimStyle* parent_style, const ON_TextMask& mask)
{
  // In order for overrides to work correctly, each text mask property must be
  // set individually.
  const ON_TextMask local_mask(mask);
  SetDrawTextMask(parent_style, local_mask.DrawTextMask());
  SetMaskColor(parent_style, local_mask.MaskColor());
  SetMaskFillType(parent_style, local_mask.MaskFillType());
  SetMaskBorder(parent_style, local_mask.MaskBorder());
  SetMaskFrameType(parent_style, local_mask.MaskFrameType());
}